

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

StatelessGenerator<std::vector<int,_std::allocator<int>_>_> __thiscall
cppqc::listOf<int>(cppqc *this,StatelessGenerator<int> *g)

{
  __uniq_ptr_impl<cppqc::detail::StatelessGenConcept<int>,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
  local_10;
  
  local_10._M_t.
  super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
  .super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>._M_head_impl =
       (tuple<cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
        )(**(code **)((long)((g->m_gen)._M_t.
                             super___uniq_ptr_impl<cppqc::detail::StatelessGenConcept<int>,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
                             .
                             super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>
                            ._M_head_impl)->super_GenConcept<int> + 0x20))();
  StatelessGenerator<std::vector<int,std::allocator<int>>>::
  StatelessGenerator<cppqc::detail::ListOfStatelessGenerator<int>>
            ((StatelessGenerator<std::vector<int,std::allocator<int>>> *)this,
             (ListOfStatelessGenerator<int> *)&local_10);
  if ((_Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
       )local_10._M_t.
        super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
        .super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>._M_head_impl !=
      (StatelessGenConcept<int> *)0x0) {
    (**(code **)(*(long *)local_10._M_t.
                          super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
                          .super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>.
                          _M_head_impl + 8))();
  }
  return (unique_ptr<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
          )(unique_ptr<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>,_std::default_delete<cppqc::detail::StatelessGenConcept<std::vector<int,_std::allocator<int>_>_>_>_>
            )this;
}

Assistant:

StatelessGenerator<std::vector<T>> listOf(
    const StatelessGenerator<T>& g = Arbitrary<T>()) {
  return detail::ListOfStatelessGenerator<T>(g);
}